

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocmds.c
# Opt level: O2

LispPTR * alloc_mdspage(short type)

{
  ushort uVar1;
  LispPTR LVar2;
  uint uVar3;
  LispPTR *NAddr;
  
  uVar1 = (ushort)*MDS_free_page_word;
  if (uVar1 == 0) {
    checkfor_storagefull(0);
    NAddr = (LispPTR *)(Lisp_world + (*Next_MDSpage_word << 8));
    Next_MDSpage = Lisp_world + ((ulong)(*Next_MDSpage_word << 8) - 0x200);
    LVar2 = LPageFromNative(Next_MDSpage);
    *Next_MDSpage_word = LVar2;
    LVar2 = LAddrFromNative(NAddr);
    LVar2 = newpage(LVar2);
    newpage(LVar2 + 0x100);
  }
  else {
    NAddr = (LispPTR *)(Lisp_world + (ulong)uVar1 * 0x100);
    uVar3 = *(uint *)(Lisp_world + (ulong)uVar1 * 0x100) & 0xffff;
    if (uVar3 != 0) {
      if ((*(ushort *)
            ((ulong)(*(uint *)(Lisp_world + (ulong)uVar1 * 0x100) >> 8 & 0xfffffffe) +
             (long)MDStypetbl ^ 2) & 0x7ff) != 1) {
        error("alloc_mdspage: Bad Free Page Link");
        goto LAB_001064c3;
      }
    }
    *MDS_free_page_word = uVar3 | 0xe0000;
  }
LAB_001064c3:
  LVar2 = LPageFromNative(NAddr);
  *(short *)((ulong)(LVar2 & 0xfffffffe) + (long)MDStypetbl ^ 2) = type;
  return NAddr;
}

Assistant:

LispPTR *alloc_mdspage(short int type) {
  LispPTR *ptr; /* points Top 32 bit of the MDS page */
  LispPTR next_page;

  /* Next_Array=(DLword *)NativeAligned2FromLAddr(((*Next_Array_word)& 0xffff ) << 8); */

  if (LOLOC(*MDS_free_page_word) != NIL) {
    ptr = (LispPTR *)NativeAligned4FromLPage(LOLOC(*MDS_free_page_word));

    if (((next_page = LOLOC(*ptr)) != 0) && (GetTypeNumber((*ptr)) != TYPE_SMALLP))
      error("alloc_mdspage: Bad Free Page Link");
    else {
      *MDS_free_page_word = S_POSITIVE | next_page;
    }
  } else {
    /* I guess Next_MDSpage is redundant */
    checkfor_storagefull(NIL);
#ifdef BIGVM
    Next_MDSpage = (DLword *)NativeAligned2FromLAddr(((*Next_MDSpage_word)) << 8);
#else
    Next_MDSpage = (DLword *)NativeAligned2FromLAddr(((*Next_MDSpage_word) & 0xffff) << 8);
#endif
    ptr = (LispPTR *)Next_MDSpage;       /* Get Pointer to First Page */
    Next_MDSpage -= DLWORDSPER_PAGE * 2; /* decrement MDS count */
#ifdef BIGVM
    *Next_MDSpage_word = LPageFromNative(Next_MDSpage);
#else
    *Next_MDSpage_word = S_POSITIVE | LPageFromNative(Next_MDSpage);
#endif
    newpage(newpage(LAddrFromNative(ptr)) + DLWORDSPER_PAGE);
  }

  Make_MDSentry(LPageFromNative(ptr), type);
  return (ptr);
}